

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<std::__cxx11::string,8ul>::SmallVector<char_const*>
          (SmallVector<std::__cxx11::string,8ul> *this,char **arg_list_begin,char **arg_list_end)

{
  long lVar1;
  long lVar2;
  long lVar3;
  allocator local_39;
  size_t local_38;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(SmallVector<std::__cxx11::string,8ul> **)this = this + 0x18;
  *(undefined8 *)(this + 0x10) = 8;
  local_38 = (long)arg_list_end - (long)arg_list_begin >> 3;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::reserve((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)this,local_38);
  if (arg_list_end != arg_list_begin) {
    lVar2 = local_38 + (local_38 == 0);
    lVar1 = 0;
    lVar3 = 0;
    do {
      ::std::__cxx11::string::string
                ((string *)(*(long *)this + lVar1),arg_list_begin[lVar3],&local_39);
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 0x20;
    } while (lVar2 != lVar3);
  }
  *(size_t *)(this + 8) = local_38;
  return;
}

Assistant:

SmallVector(const U *arg_list_begin, const U *arg_list_end) SPIRV_CROSS_NOEXCEPT : SmallVector()
	{
		auto count = size_t(arg_list_end - arg_list_begin);
		reserve(count);
		for (size_t i = 0; i < count; i++, arg_list_begin++)
			new (&this->ptr[i]) T(*arg_list_begin);
		this->buffer_size = count;
	}